

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderPass.cpp
# Opt level: O2

void __thiscall myvk::RenderPass::~RenderPass(RenderPass *this)

{
  (this->super_DeviceObjectBase).super_Base._vptr_Base = (_func_int **)&PTR__RenderPass_00322868;
  if (this->m_render_pass != (VkRenderPass)0x0) {
    (*vkDestroyRenderPass)
              (((this->m_device_ptr).super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->m_device,this->m_render_pass,(VkAllocationCallbacks *)0x0);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_device_ptr).super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_DeviceObjectBase).super_Base.super_enable_shared_from_this<myvk::Base>.
              _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

RenderPass::~RenderPass() {
	if (m_render_pass)
		vkDestroyRenderPass(m_device_ptr->GetHandle(), m_render_pass, nullptr);
}